

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_PkitsTest10PolicyMappings_::
Section10InvalidPolicyMappingTest2Subpart2<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::TestBody(Section10InvalidPolicyMappingTest2Subpart2<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  undefined1 local_b8 [8];
  PkitsTestInfo info;
  char *crls [2];
  char *certs [3];
  Section10InvalidPolicyMappingTest2Subpart2<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
  *this_local;
  
  crls[1] = "TrustAnchorRootCertificate";
  info.user_constrained_policy_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)anon_var_dwarf_19793f;
  crls[0] = "Mapping1to2CACRL";
  PkitsTestInfo::PkitsTestInfo((PkitsTestInfo *)local_b8);
  local_b8 = (undefined1  [8])0x6f5d6f;
  info.time.year._0_1_ = 0;
  PkitsTestInfo::SetInitialPolicyMappingInhibit((PkitsTestInfo *)local_b8,true);
  PkitsTestInfo::SetUserConstrainedPolicySet((PkitsTestInfo *)local_b8,"");
  PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>::RunTest<3ul,2ul>
            ((PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate> *)this
             ,(char *(*) [3])(crls + 1),
             (char *(*) [2])
             &info.user_constrained_policy_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (PkitsTestInfo *)local_b8);
  PkitsTestInfo::~PkitsTestInfo((PkitsTestInfo *)local_b8);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest10PolicyMappings,
                     Section10InvalidPolicyMappingTest2Subpart2) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "Mapping1to2CACert",
                               "InvalidPolicyMappingTest2EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "Mapping1to2CACRL"};
  PkitsTestInfo info;
  info.test_number = "4.10.2";
  info.should_validate = false;
  info.SetInitialPolicyMappingInhibit(true);
  info.SetUserConstrainedPolicySet("");

  this->RunTest(certs, crls, info);
}